

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

bool __thiscall IPStats::SaveToCsv(IPStats *this,char *file_name)

{
  pointer __first;
  pointer __last;
  FILE *__stream;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  IPStatsRecord *pIVar4;
  vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> records;
  int last_err;
  allocator_type local_39;
  vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> local_38;
  int local_1c;
  
  local_1c = 0;
  __stream = (FILE *)ithi_file_open_ex(file_name,"wt",&local_1c);
  if (__stream != (FILE *)0x0) {
    std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::vector
              (&local_38,(ulong)(this->ip_records).tableCount,&local_39);
    __last = local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __first = local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar1 = (ulong)(this->ip_records).tableSize;
    if (uVar1 != 0) {
      uVar2 = 0;
      lVar3 = 0;
      do {
        for (pIVar4 = (this->ip_records).hashBin[uVar2]; pIVar4 != (IPStatsRecord *)0x0;
            pIVar4 = pIVar4->HashNext) {
          local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = pIVar4;
          lVar3 = lVar3 + 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != uVar1);
    }
    if (local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar1 = (long)local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar3 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<IPStatsRecord**,std::vector<IPStatsRecord*,std::allocator<IPStatsRecord*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(IPStatsRecord*,IPStatsRecord*)>>
                ((__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                  )local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                  )local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(IPStatsRecord_*,_IPStatsRecord_*)>)0x164bf6);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<IPStatsRecord**,std::vector<IPStatsRecord*,std::allocator<IPStatsRecord*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(IPStatsRecord*,IPStatsRecord*)>>
                ((__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                  )__first,
                 (__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                  )__last,(_Iter_comp_iter<bool_(*)(IPStatsRecord_*,_IPStatsRecord_*)>)0x164bf6);
    }
    if (local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar1 = 0;
      do {
        IPStatsRecord::WriteRecord
                  (local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar1],(FILE *)__stream);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)((long)local_38.
                                     super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_38.
                                     super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    fclose(__stream);
    if (local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
        super__Vector_impl_data._M_start != (IPStatsRecord **)0x0) {
      operator_delete(local_38.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool IPStats::SaveToCsv(char const* file_name)
{
    bool ret = true;
    int last_err = 0;
    FILE* F = ithi_file_open_ex(file_name, "wt", &last_err);

    if (F == NULL) {
        ret = false;
    }
    else {
        /* Enumerate the records in the binhash, store the keys in a vector */
        std::vector<IPStatsRecord*> records(ip_records.GetCount());
        size_t record_index = 0;

        for (uint32_t i = 0; i < ip_records.GetSize(); i++)
        {
            IPStatsRecord* record = ip_records.GetEntry(i);

            while (record != NULL) {
                records[record_index] = record;
                record_index++;
                record = record->HashNext;
            }
        }
        /* Sort the records by IP addresses */
        std::sort(records.begin(), records.end(), IPAddressIsLower);
        /* print the records to the file */
        for (size_t i = 0; i < records.size(); i++) {
            records[i]->WriteRecord(F);
        }
        /* Close the file */
        fclose(F);
    }

    return ret;
}